

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

shared_ptr<mir::types::IntTy> mir::types::new_int_ty(void)

{
  _func_int **pp_Var1;
  element_type *in_RDI;
  shared_ptr<mir::types::IntTy> sVar2;
  
  (in_RDI->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)0x0;
  pp_Var1 = (_func_int **)operator_new(0x18);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001ee870;
  pp_Var1[2] = (_func_int *)&PTR_display_001efd88;
  in_RDI[1].super_Ty.super_Displayable._vptr_Displayable = pp_Var1;
  (in_RDI->super_Ty).super_Displayable._vptr_Displayable = pp_Var1 + 2;
  sVar2.super___shared_ptr<mir::types::IntTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_display_001efd88;
  sVar2.super___shared_ptr<mir::types::IntTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<mir::types::IntTy>)
         sVar2.super___shared_ptr<mir::types::IntTy,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IntTy> new_int_ty() { return std::make_shared<IntTy>(); }